

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
ipx::Model::ScaleBackBasicSolution(Model *this,Vector *x,Vector *slack,Vector *y,Vector *z)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  double *pdVar4;
  int *piVar5;
  
  if ((this->colscale_)._M_size != 0) {
    std::valarray<double>::operator*=(x,&this->colscale_);
    std::valarray<double>::operator/=(z,&this->colscale_);
  }
  if ((this->rowscale_)._M_size != 0) {
    std::valarray<double>::operator*=(y,&this->rowscale_);
    std::valarray<double>::operator/=(slack,&this->rowscale_);
  }
  piVar2 = (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = x->_M_data;
  pdVar4 = z->_M_data;
  for (piVar5 = (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    iVar1 = *piVar5;
    pdVar3[iVar1] = -pdVar3[iVar1];
    pdVar4[iVar1] = -pdVar4[iVar1];
  }
  return;
}

Assistant:

void Model::ScaleBackBasicSolution(Vector& x, Vector& slack, Vector& y,
                                   Vector& z) const {
    if (colscale_.size() > 0) {
        x *= colscale_;
        z /= colscale_;
    }
    if (rowscale_.size() > 0) {
        y *= rowscale_;
        slack /= rowscale_;
    }
    for (Int j : flipped_vars_) {
        x[j] *= -1.0;
        z[j] *= -1.0;
    }
}